

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.h
# Opt level: O0

ostream * covenant::operator<<(ostream *o,Rule *r)

{
  bool bVar1;
  size_type sVar2;
  ulong uVar3;
  reference pvVar4;
  ostream *poVar5;
  long in_RSI;
  shared_ptr<covenant::TerminalFactory> *in_RDI;
  uint i;
  TermFactory tfac;
  Rule *in_stack_ffffffffffffff68;
  shared_ptr<covenant::TerminalFactory> *in_stack_ffffffffffffff70;
  string local_58 [40];
  unsigned_long in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd8;
  uint uVar6;
  shared_ptr local_20 [24];
  shared_ptr<covenant::TerminalFactory> *local_8;
  
  local_8 = in_RDI;
  sVar2 = std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::size
                    ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)(in_RSI + 0x10));
  if (sVar2 == 0) {
    std::operator<<((ostream *)local_8,"e");
  }
  else {
    Rule::getTermFactory(in_stack_ffffffffffffff68);
    bVar1 = boost::shared_ptr::operator_cast_to_bool(local_20);
    if (!bVar1) {
      __assert_fail("tfac",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/caballa[P]covenant/include/CFG.h"
                    ,0xa0,"ostream &covenant::operator<<(ostream &, Rule)");
    }
    uVar6 = 0;
    while( true ) {
      uVar3 = (ulong)uVar6;
      sVar2 = std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::size
                        ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)(in_RSI + 0x10));
      if (sVar2 <= uVar3) break;
      pvVar4 = std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::operator[]
                         ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)(in_RSI + 0x10),
                          (ulong)uVar6);
      bVar1 = Sym::isVar(pvVar4);
      if (bVar1) {
        pvVar4 = std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::operator[]
                           ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)(in_RSI + 0x10)
                            ,(ulong)uVar6);
        in_stack_ffffffffffffffd8 = pvVar4->x;
        poVar5 = operator<<((ostream *)in_stack_ffffffffffffff68,
                            (Sym)(int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
        std::operator<<(poVar5," ");
      }
      else {
        in_stack_ffffffffffffff70 = local_8;
        boost::shared_ptr<covenant::TerminalFactory>::operator->(local_8);
        pvVar4 = std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::operator[]
                           ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)(in_RSI + 0x10)
                            ,(ulong)uVar6);
        Sym::symID(pvVar4);
        TerminalFactory::remap_abi_cxx11_
                  ((TerminalFactory *)CONCAT44(uVar6,in_stack_ffffffffffffffd8),
                   in_stack_ffffffffffffffd0);
        in_stack_ffffffffffffff68 =
             (Rule *)std::operator<<((ostream *)in_stack_ffffffffffffff70,local_58);
        std::operator<<((ostream *)in_stack_ffffffffffffff68," ");
        std::__cxx11::string::~string(local_58);
      }
      uVar6 = uVar6 + 1;
    }
    boost::shared_ptr<covenant::TerminalFactory>::~shared_ptr
              ((shared_ptr<covenant::TerminalFactory> *)0x1d410f);
  }
  return (ostream *)local_8;
}

Assistant:

ostream& operator<<(ostream& o, Rule r)
    {
      if( r._syms.size() == 0 )
      { 
        o << "e"; 
      } 
      else 
      {
        TermFactory tfac = r.getTermFactory ();
        assert (tfac);
        for( unsigned int i=0; i < r._syms.size(); i++ )
        {
          if (r._syms[i].isVar ())
          {
            o << r._syms[i] << " " ;
          }
          else
          {
            // we apply the dictionary to output the corresponding
            // string.
            o << tfac->remap(r._syms[i].symID ()) << " " ;
          }
        }
      }
      return o;
    }